

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O1

bool __thiscall branch_and_reduce_algorithm::almost_dominated(branch_and_reduce_algorithm *this)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pvVar4;
  int *piVar5;
  int *piVar6;
  iterator __position;
  bool bVar7;
  undefined8 in_RAX;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  iterator __begin3;
  int *piVar13;
  bool bVar14;
  int vtx;
  undefined8 uStack_38;
  
  if (this->n < 1) {
    bVar7 = false;
  }
  else {
    lVar12 = 0;
    bVar7 = false;
    uStack_38 = in_RAX;
    do {
      piVar2 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar2[lVar12] < 0) {
        iVar11 = (this->used).uid;
        (this->used).uid = iVar11 + 1;
        if (iVar11 < -1) {
          piVar3 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar9 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar3;
          if (lVar9 != 0) {
            uVar10 = 0;
            do {
              piVar3[uVar10] = 0;
              uVar10 = uVar10 + 1;
            } while ((uVar10 & 0xffffffff) < (ulong)(lVar9 >> 2));
          }
          (this->used).uid = 1;
        }
        piVar3 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3[lVar12] = (this->used).uid;
        pvVar4 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar5 = *(pointer *)
                  ((long)&pvVar4[lVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        piVar13 = pvVar4[lVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (piVar8 = piVar13; piVar8 != piVar5; piVar8 = piVar8 + 1) {
          if (piVar2[*piVar8] < 0) {
            piVar3[*piVar8] = (this->used).uid;
          }
        }
        for (; piVar13 != piVar5; piVar13 = piVar13 + 1) {
          iVar11 = *piVar13;
          piVar2 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (piVar2[iVar11] < 0) {
            uStack_38 = CONCAT44(0xffffffff,(undefined4)uStack_38);
            pvVar4 = (this->adj).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            piVar8 = pvVar4[iVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar6 = *(pointer *)
                      ((long)&pvVar4[iVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + 8);
            bVar14 = piVar8 == piVar6;
            if (!bVar14) {
              iVar11 = 0;
              do {
                iVar1 = *piVar8;
                if ((piVar2[iVar1] < 0) &&
                   ((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar1] != (this->used).uid)) {
                  iVar11 = iVar11 + 1;
                  uStack_38 = CONCAT44(iVar1,(undefined4)uStack_38);
                }
                if (1 < iVar11) {
                  if (!bVar14) goto LAB_0010cab7;
                  break;
                }
                piVar8 = piVar8 + 1;
                bVar14 = piVar8 == piVar6;
              } while (!bVar14);
            }
            __position._M_current =
                 (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&this->b_vtcs,__position,
                         (int *)((long)&uStack_38 + 4));
            }
            else {
              *__position._M_current = uStack_38._4_4_;
              (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            bVar7 = true;
          }
LAB_0010cab7:
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->n);
  }
  return bVar7;
}

Assistant:

bool branch_and_reduce_algorithm::almost_dominated()
{
    bool found = false;
    for (int v = 0; v < n; v++)
        if (x[v] < 0)
        {
            used.clear();
            used.add(v);
            for (int u : adj[v])
                if (x[u] < 0)
                    used.add(u);
            for (int u : adj[v])
                if (x[u] < 0)
                {
                    int cnt = 0;
                    int vtx = -1;
                    for (int w : adj[u])
                    {
                        if (x[w] < 0 && !used.get(w))
                        {
                            cnt++;
                            vtx = w;
                        }
                        if (cnt >= 2)
                            goto loop;
                    }
                    found = true;
                    b_vtcs.push_back(vtx);

                loop:;
                }
        }
    return found;
}